

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  Vec_Ptr_t *p;
  Vec_Wec_t *vFanins;
  Vec_Str_t *vFixed;
  Vec_Wrd_t *vTruths;
  long *plVar1;
  word Entry;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Sfm_Ntk_t *pSVar4;
  char Entry_00;
  int iVar5;
  long lVar6;
  int iVar7;
  
  p = Abc_NtkAssignIDs2(pNtk);
  iVar7 = p->nSize;
  iVar5 = pNtk->vCis->nSize + iVar7 + pNtk->vCos->nSize;
  vFanins = Vec_WecStart(iVar5);
  vFixed = Vec_StrStart(iVar5);
  vTruths = Vec_WrdStart(iVar5);
  iVar5 = 0;
  if (iVar7 < 1) {
    iVar7 = iVar5;
  }
  for (; iVar5 != iVar7; iVar5 = iVar5 + 1) {
    plVar1 = (long *)Vec_PtrEntry(p,iVar5);
    Entry = Abc_SopToTruth((char *)plVar1[7],*(int *)((long)plVar1 + 0x1c));
    Vec_WrdWriteEntry(vTruths,(int)plVar1[8],Entry);
    if (1 < Entry + 1) {
      pVVar2 = Vec_WecEntry(vFanins,(int)plVar1[8]);
      Vec_IntGrow(pVVar2,*(int *)((long)plVar1 + 0x1c));
      for (lVar6 = 0; lVar6 < *(int *)((long)plVar1 + 0x1c); lVar6 = lVar6 + 1) {
        Vec_IntPush(pVVar2,*(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                             (long)*(int *)(plVar1[4] + lVar6 * 4) * 8) + 0x40));
      }
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar7);
    pVVar2 = Vec_WecEntry(vFanins,(pAVar3->field_6).iTemp);
    Vec_IntGrow(pVVar2,(pAVar3->vFanins).nSize);
    for (lVar6 = 0; lVar6 < (pAVar3->vFanins).nSize; lVar6 = lVar6 + 1) {
      Vec_IntPush(pVVar2,*(int *)((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar6]]
                                 + 0x40));
    }
  }
  Vec_PtrFree(p);
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && (iPivot <= iVar7)) &&
       ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      Vec_StrWriteEntry(vFixed,(pAVar3->field_6).iTemp,Entry_00);
    }
  }
  pSVar4 = Sfm_NtkConstruct(vFanins,pNtk->vCis->nSize,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,
                            vTruths);
  return pSVar4;
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}